

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O3

UChar * u_strFromUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  UChar *pUVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  UChar *pUVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  int32_t i;
  uint local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  int32_t local_44;
  UChar *local_40;
  int32_t *local_38;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((-1 < destCapacity) && (-2 < srcLength)) && (src != (char *)0x0 || srcLength == 0)) &&
       ((subchar < 0x110000 && (destCapacity == 0 || dest != (UChar *)0x0)) &&
        (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      pUVar1 = dest + (uint)destCapacity;
      local_48 = subchar;
      local_44 = destCapacity;
      local_40 = dest;
      local_38 = pDestLength;
      if (srcLength < 0) {
        bVar6 = *src;
        uVar5 = 0;
        if (bVar6 != 0 && destCapacity != 0) {
          uVar5 = 0;
          local_4c = 0;
          iVar11 = 0;
          pUVar7 = dest;
          pcVar10 = src;
          do {
            iVar3 = (int)uVar5;
            lVar9 = (long)iVar3 + 1;
            local_50 = (uint)lVar9;
            if ((char)bVar6 < '\0') {
              uVar2 = (uint)bVar6;
              if ((bVar6 & 0xf0) == 0xe0) {
                if ((((byte)" 000000000000\x1000"[uVar2 & 0xf] >> ((byte)src[lVar9] >> 5) & 1) == 0)
                   || (0x3f < (byte)((byte)pcVar10[2] ^ 0x80))) {
LAB_002ff043:
                  uVar2 = utf8_nextCharSafeBody_63((uint8_t *)src,(int32_t *)&local_50,-1,uVar2,-1);
                  if ((int)uVar2 < 0) {
                    if ((int)local_48 < 0) goto LAB_002ff378;
                    local_4c = local_4c + 1;
                    uVar2 = local_48;
                  }
                  if (uVar2 < 0x10000) {
                    *pUVar7 = (UChar)uVar2;
                    goto LAB_002fef98;
                  }
                  dest = pUVar7 + 1;
                  *pUVar7 = (short)(uVar2 >> 10) + L'ퟀ';
                  if (dest < pUVar1) {
                    pUVar7[1] = (UChar)uVar2 & 0x3ffU | 0xdc00;
                    dest = pUVar7 + 2;
                    goto LAB_002fef9c;
                  }
                  uVar5 = (ulong)(int)local_50;
                  bVar6 = src[uVar5];
                  iVar11 = 1;
                  goto LAB_002ff268;
                }
                *pUVar7 = ((byte)src[lVar9] & 0x3f) << 6 | (ushort)bVar6 << 0xc |
                          (byte)pcVar10[2] ^ 0x80;
                local_50 = iVar3 + 3;
              }
              else {
                if ((0x1d < (byte)(bVar6 + 0x3e)) || (0x3f < (byte)((byte)src[lVar9] ^ 0x80)))
                goto LAB_002ff043;
                *pUVar7 = (ushort)((uVar2 & 0x1f) << 6) | (byte)src[lVar9] ^ 0x80;
                local_50 = iVar3 + 2;
              }
              dest = pUVar7 + 1;
            }
            else {
              *pUVar7 = (ushort)bVar6;
LAB_002fef98:
              dest = pUVar7 + 1;
            }
LAB_002fef9c:
            uVar5 = (ulong)(int)local_50;
            bVar6 = src[uVar5];
            if ((bVar6 == 0) || (pcVar10 = src + uVar5, pUVar7 = dest, pUVar1 <= dest))
            goto LAB_002ff268;
          } while( true );
        }
        local_4c = 0;
        iVar11 = 0;
LAB_002ff268:
        if (bVar6 != 0) {
          lVar9 = (long)(int)uVar5;
          do {
            iVar3 = (int)uVar5;
            uVar5 = (long)iVar3 + 1;
            local_50 = (uint)uVar5;
            if ((char)bVar6 < '\0') {
              if ((bVar6 & 0xf0) == 0xe0) {
                if ((((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[uVar5] >> 5) & 1) == 0)
                   || (-0x41 < src[lVar9 + 2])) {
LAB_002ff2eb:
                  uVar2 = utf8_nextCharSafeBody_63
                                    ((uint8_t *)src,(int32_t *)&local_50,-1,(uint)bVar6,-1);
                  if ((int)uVar2 < 0) {
                    if ((int)local_48 < 0) goto LAB_002ff378;
                    local_4c = local_4c + 1;
                    uVar2 = local_48;
                  }
                  iVar11 = (iVar11 - (uint)(uVar2 < 0x10000)) + 2;
                  uVar5 = (ulong)local_50;
                  goto LAB_002ff322;
                }
                local_50 = iVar3 + 3;
              }
              else {
                if ((0x1d < (byte)(bVar6 + 0x3e)) || (-0x41 < src[uVar5])) goto LAB_002ff2eb;
                local_50 = iVar3 + 2;
              }
              iVar11 = iVar11 + 1;
              uVar5 = (ulong)local_50;
            }
            else {
              iVar11 = iVar11 + 1;
            }
LAB_002ff322:
            lVar9 = (long)(int)uVar5;
            bVar6 = src[lVar9];
            uVar5 = uVar5 & 0xffffffff;
          } while (bVar6 != 0);
        }
      }
      else {
        local_54 = 0;
        uVar2 = (uint)srcLength / 3;
        if (destCapacity <= (int)((uint)srcLength / 3)) {
          uVar2 = destCapacity;
        }
        iVar11 = 0;
        local_4c = 0;
        if (2 < (int)uVar2) {
          local_4c = 0;
LAB_002ff0bb:
          do {
            lVar8 = (long)(int)local_54;
            lVar9 = lVar8 + 1;
            uVar4 = (uint)lVar9;
            bVar6 = src[lVar8];
            if ((char)bVar6 < '\0') {
              if ((bVar6 & 0xf0) == 0xe0) {
                if (((srcLength <= (int)(lVar8 + 2)) ||
                    (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[lVar9] >> 5) & 1) == 0)
                    ) || (0x3f < (byte)((byte)src[lVar8 + 2] ^ 0x80))) goto LAB_002ff1cf;
                *dest = ((byte)src[lVar9] & 0x3f) << 6 | (ushort)bVar6 << 0xc |
                        (byte)src[lVar8 + 2] ^ 0x80;
                local_54 = local_54 + 3;
LAB_002ff1c6:
                dest = dest + 1;
                uVar4 = uVar2;
                goto LAB_002ff0de;
              }
              if (((0xe1 < (byte)(bVar6 + 0x20)) && (uVar4 != srcLength)) &&
                 ((byte)((byte)src[lVar9] ^ 0x80) < 0x40)) {
                *dest = (ushort)((bVar6 & 0x1f) << 6) | (byte)src[lVar9] ^ 0x80;
                local_54 = local_54 + 2;
                goto LAB_002ff1c6;
              }
LAB_002ff1cf:
              if (((subchar < 0x10000) && (bVar6 < 0xf0)) || (uVar2 = uVar2 - 1, uVar2 != 0)) {
                local_54 = uVar4;
                uVar4 = utf8_nextCharSafeBody_63
                                  ((uint8_t *)src,(int32_t *)&local_54,srcLength,(uint)bVar6,-1);
                if ((int)uVar4 < 0) {
                  if ((int)local_48 < 0) goto LAB_002ff378;
                  local_4c = local_4c + 1;
                  uVar4 = local_48;
                }
                subchar = local_48;
                if (uVar4 < 0x10000) {
                  *dest = (UChar)uVar4;
                  goto LAB_002ff0da;
                }
                *dest = (short)(uVar4 >> 10) + L'ퟀ';
                dest[1] = (UChar)uVar4 & 0x3ffU | 0xdc00;
                dest = dest + 2;
                uVar4 = uVar2;
                goto LAB_002ff0de;
              }
            }
            else {
              *dest = (short)(char)bVar6;
              local_54 = uVar4;
LAB_002ff0da:
              dest = dest + 1;
              uVar4 = uVar2;
LAB_002ff0de:
              uVar2 = uVar4 - 1;
              if (1 < (int)uVar4) goto LAB_002ff0bb;
            }
            uVar2 = (int)(srcLength - local_54) / 3;
            uVar4 = (uint)((ulong)((long)pUVar1 - (long)dest) >> 1);
            if ((int)uVar4 <= (int)uVar2) {
              uVar2 = uVar4;
            }
          } while (2 < (int)uVar2);
        }
        if (((int)local_54 < srcLength) && (dest < pUVar1)) {
          pUVar7 = dest;
          do {
            lVar8 = (long)(int)local_54;
            lVar9 = lVar8 + 1;
            uVar2 = (uint)lVar9;
            bVar6 = src[lVar8];
            if ((char)bVar6 < '\0') {
              if ((bVar6 & 0xf0) == 0xe0) {
                if (((srcLength <= (int)(lVar8 + 2)) ||
                    (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[lVar9] >> 5) & 1) == 0)
                    ) || (0x3f < (byte)((byte)src[lVar8 + 2] ^ 0x80))) {
LAB_002fedf6:
                  local_54 = uVar2;
                  uVar2 = utf8_nextCharSafeBody_63
                                    ((uint8_t *)src,(int32_t *)&local_54,srcLength,(uint)bVar6,-1);
                  if ((int)uVar2 < 0) {
                    if ((int)local_48 < 0) goto LAB_002ff378;
                    local_4c = local_4c + 1;
                    uVar2 = local_48;
                  }
                  if (uVar2 < 0x10000) {
                    *pUVar7 = (UChar)uVar2;
                    goto LAB_002fed2b;
                  }
                  dest = pUVar7 + 1;
                  *pUVar7 = (short)(uVar2 >> 10) + L'ퟀ';
                  if (dest < pUVar1) {
                    pUVar7[1] = (UChar)uVar2 & 0x3ffU | 0xdc00;
                    dest = pUVar7 + 2;
                    goto LAB_002fed2f;
                  }
                  iVar11 = 1;
                  break;
                }
                *pUVar7 = ((byte)src[lVar9] & 0x3f) << 6 | (ushort)bVar6 << 0xc |
                          (byte)src[lVar8 + 2] ^ 0x80;
                local_54 = local_54 + 3;
              }
              else {
                if ((((byte)(bVar6 + 0x20) < 0xe2) || (uVar2 == srcLength)) ||
                   (0x3f < (byte)((byte)src[lVar9] ^ 0x80))) goto LAB_002fedf6;
                *pUVar7 = (ushort)((bVar6 & 0x1f) << 6) | (byte)src[lVar9] ^ 0x80;
                local_54 = local_54 + 2;
              }
              dest = pUVar7 + 1;
            }
            else {
              *pUVar7 = (short)(char)bVar6;
              local_54 = uVar2;
LAB_002fed2b:
              dest = pUVar7 + 1;
            }
LAB_002fed2f:
            if ((srcLength <= (int)local_54) || (pUVar7 = dest, pUVar1 <= dest)) break;
          } while( true );
        }
        if ((int)local_54 < srcLength) {
          uVar2 = local_54;
          do {
            lVar9 = (long)(int)uVar2;
            uVar5 = lVar9 + 1;
            local_54 = (uint)uVar5;
            bVar6 = src[lVar9];
            if ((char)bVar6 < '\0') {
              if ((bVar6 & 0xf0) == 0xe0) {
                if (((srcLength <= (int)(lVar9 + 2)) ||
                    (((byte)" 000000000000\x1000"[bVar6 & 0xf] >> ((byte)src[uVar5] >> 5) & 1) == 0)
                    ) || (-0x41 < src[lVar9 + 2])) {
LAB_002fef02:
                  uVar2 = utf8_nextCharSafeBody_63
                                    ((uint8_t *)src,(int32_t *)&local_54,srcLength,(uint)bVar6,-1);
                  if ((int)uVar2 < 0) {
                    if ((int)local_48 < 0) {
LAB_002ff378:
                      *pErrorCode = U_INVALID_CHAR_FOUND;
                      return (UChar *)0x0;
                    }
                    local_4c = local_4c + 1;
                    uVar2 = local_48;
                  }
                  iVar11 = (iVar11 - (uint)(uVar2 < 0x10000)) + 2;
                  uVar5 = (ulong)local_54;
                  goto LAB_002fef3b;
                }
                local_54 = uVar2 + 3;
              }
              else {
                if ((((byte)(bVar6 + 0x20) < 0xe2) || (local_54 == srcLength)) ||
                   (-0x41 < src[uVar5])) goto LAB_002fef02;
                local_54 = uVar2 + 2;
              }
              iVar11 = iVar11 + 1;
              uVar5 = (ulong)local_54;
            }
            else {
              iVar11 = iVar11 + 1;
            }
LAB_002fef3b:
            uVar2 = (uint)uVar5;
          } while ((int)uVar2 < srcLength);
        }
      }
      pUVar1 = local_40;
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = local_4c;
      }
      iVar11 = iVar11 + (int)((ulong)((long)dest - (long)local_40) >> 1);
      if (local_38 != (int32_t *)0x0) {
        *local_38 = iVar11;
      }
      u_terminateUChars_63(local_40,local_44,iVar11,pErrorCode);
      return pUVar1;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromUTF8WithSub(UChar *dest,
              int32_t destCapacity,
              int32_t *pDestLength,
              const char* src,
              int32_t srcLength,
              UChar32 subchar, int32_t *pNumSubstitutions,
              UErrorCode *pErrorCode){
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    /*
     * Inline processing of UTF-8 byte sequences:
     *
     * Byte sequences for the most common characters are handled inline in
     * the conversion loops. In order to reduce the path lengths for those
     * characters, the tests are arranged in a kind of binary search.
     * ASCII (<=0x7f) is checked first, followed by the dividing point
     * between 2- and 3-byte sequences (0xe0).
     * The 3-byte branch is tested first to speed up CJK text.
     * The compiler should combine the subtractions for the two tests for 0xe0.
     * Each branch then tests for the other end of its range.
     */

    if(srcLength < 0){
        /*
         * Transform a NUL-terminated string.
         * The code explicitly checks for NULs only in the lead byte position.
         * A NUL byte in the trail byte position fails the trail byte range check anyway.
         */
        int32_t i;
        UChar32 c;
        for(i = 0; (c = (uint8_t)src[i]) != 0 && (pDest < pDestLimit);) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while((c = (uint8_t)src[i]) != 0) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    } else /* srcLength >= 0 */ {
        /* Faster loop without ongoing checking for srcLength and pDestLimit. */
        int32_t i = 0;
        UChar32 c;
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            int32_t count = (int32_t)(pDestLimit - pDest);
            int32_t count2 = (srcLength - i) / 3;
            if(count > count2) {
                count = count2; /* min(remaining dest, remaining src/3) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }

            do {
                // modified copy of U8_NEXT()
                c = (uint8_t)src[i++];
                if(U8_IS_SINGLE(c)) {
                    *pDest++=(UChar)c;
                } else {
                    uint8_t __t1, __t2;
                    if( /* handle U+0800..U+FFFF inline */
                            (0xe0<=(c) && (c)<0xf0) &&
                            ((i)+1)<srcLength &&
                            U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                            (__t2=src[(i)+1]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                        i+=2;
                    } else if( /* handle U+0080..U+07FF inline */
                            ((c)<0xe0 && (c)>=0xc2) &&
                            ((i)!=srcLength) &&
                            (__t1=src[i]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0x1f)<<6)|__t1;
                        ++(i);
                    } else {
                        if(c >= 0xf0 || subchar > 0xffff) {
                            // We may read up to four bytes and write up to two UChars,
                            // which we didn't account for with computing count,
                            // so we adjust it here.
                            if(--count == 0) {
                                --i;  // back out byte c
                                break;
                            }
                        }

                        /* function call for "complicated" and error cases */
                        (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                        if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        } else if(c<=0xFFFF) {
                            *(pDest++)=(UChar)c;
                        } else {
                            *(pDest++)=U16_LEAD(c);
                            *(pDest++)=U16_TRAIL(c);
                        }
                    }
                }
            } while(--count > 0);
        }

        while(i < srcLength && (pDest < pDestLimit)) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while(i < srcLength) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    }

    reqLength+=(int32_t)(pDest - dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest,destCapacity,reqLength,pErrorCode);

    return dest;
}